

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O2

Integer pnga_sprs_array_create(Integer idim,Integer jdim,Integer type,Integer size)

{
  int iVar1;
  _sparse_array *p_Var2;
  Integer IVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  
  iVar1 = _ga_sync_end;
  bVar8 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (bVar8) {
    IVar3 = pnga_pgroup_get_default();
    pnga_pgroup_sync(IVar3);
  }
  lVar7 = (long)(int)type;
  IVar3 = pnga_type_f2c(lVar7);
  if (999 < IVar3) {
    IVar3 = pnga_type_f2c(lVar7);
    if (IVar3 < 0x4e8) {
      pnga_type_f2c(lVar7);
    }
  }
  if (idim < 1 || jdim < 1) {
    pnga_error("(ga_sprs_array_create) Invalid array dimenensions",0);
  }
  p_Var2 = SPA;
  lVar6 = -1000;
  lVar5 = 0;
  do {
    if (lVar5 == 0x640000) {
LAB_00140fe6:
      if (iVar1 != 0) {
        IVar3 = pnga_pgroup_get_default();
        pnga_pgroup_sync(IVar3);
      }
      return lVar6;
    }
    if (*(long *)((long)&SPA->active + lVar5) == 0) {
      *(undefined8 *)((long)&SPA->active + lVar5) = 1;
      pvVar4 = malloc(0x2000);
      *(void **)((long)&p_Var2->idx + lVar5) = pvVar4;
      pvVar4 = malloc(0x2000);
      *(void **)((long)&SPA->jdx + lVar5) = pvVar4;
      IVar3 = pnga_type_f2c(lVar7);
      p_Var2 = SPA;
      *(Integer *)((long)&SPA->type + lVar5) = IVar3;
      *(Integer *)((long)&p_Var2->idx_size + lVar5) = size;
      lVar7 = *(long *)(BYTE_ARRAY_001cd4a9 + IVar3 * 0x10 + 0xdf);
      *(long *)((long)&p_Var2->size + lVar5) = lVar7;
      pvVar4 = malloc(lVar7 << 10);
      *(void **)((long)&p_Var2->val + lVar5) = pvVar4;
      p_Var2 = SPA;
      *(undefined8 *)((long)&SPA->nval + lVar5) = 0;
      *(undefined8 *)((long)&p_Var2->maxval + lVar5) = 0x400;
      *(Integer *)((long)&p_Var2->idim + lVar5) = idim;
      *(Integer *)((long)&p_Var2->jdim + lVar5) = jdim;
      IVar3 = pnga_pgroup_get_default();
      *(Integer *)((long)&SPA->grp + lVar5) = IVar3;
      IVar3 = pnga_pgroup_nnodes(IVar3);
      *(Integer *)((long)&SPA->nprocs + lVar5) = IVar3;
      goto LAB_00140fe6;
    }
    lVar5 = lVar5 + 200;
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

Integer pnga_sprs_array_create(Integer idim, Integer jdim, Integer type, Integer size)
{
  Integer i, hdl, s_a;
  int local_sync_begin,local_sync_end;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(pnga_pgroup_get_default());
  GAvalidtypeM(pnga_type_f2c((int)type));
  if (idim <= 0 || jdim <= 0)
    pnga_error("(ga_sprs_array_create) Invalid array dimenensions",0);
  for (i=0; i<MAX_ARRAYS; i++) {
    if (!SPA[i].active) {
      SPA[i].active = 1;
      SPA[i].idx = (Integer*)malloc(INIT_BUF_SIZE*sizeof(Integer));
      SPA[i].jdx = (Integer*)malloc(INIT_BUF_SIZE*sizeof(Integer));
      SPA[i].type = pnga_type_f2c((int)(type));
      SPA[i].idx_size = size;
      SPA[i].size = GAsizeofM(SPA[i].type);
      SPA[i].val = malloc(INIT_BUF_SIZE*SPA[i].size);
      SPA[i].nval = 0;
      SPA[i].maxval = INIT_BUF_SIZE;
      SPA[i].idim = idim;
      SPA[i].jdim = jdim;
      SPA[i].grp = pnga_pgroup_get_default();
      SPA[i].nprocs = pnga_pgroup_nnodes(SPA[i].grp);
      hdl = i;
      s_a = hdl - GA_OFFSET;
      break;
    }
  }
  if (local_sync_end) pnga_pgroup_sync(pnga_pgroup_get_default());
  return s_a;
}